

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_initkey(BlowfishContext *ctx)

{
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  
  puVar2 = parray;
  puVar3 = ctx->P;
  for (lVar1 = 0x12; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  memcpy(ctx,sbox0,0x400);
  memcpy(ctx->S1,sbox1,0x400);
  memcpy(ctx->S2,sbox2,0x400);
  memcpy(ctx->S3,sbox3,0x400);
  return;
}

Assistant:

void blowfish_initkey(BlowfishContext *ctx)
{
    int i;

    for (i = 0; i < 18; i++) {
        ctx->P[i] = parray[i];
    }

    for (i = 0; i < 256; i++) {
        ctx->S0[i] = sbox0[i];
        ctx->S1[i] = sbox1[i];
        ctx->S2[i] = sbox2[i];
        ctx->S3[i] = sbox3[i];
    }
}